

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O1

bool __thiscall libcellml::Model::removeUnits(Model *this,size_t index)

{
  EntityImpl *pEVar1;
  size_type sVar2;
  UnitsImpl *this_00;
  ulong uVar3;
  
  pEVar1 = (this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl;
  sVar2 = pEVar1[4].mId._M_string_length;
  uVar3 = (long)(pEVar1[4].mId.field_2._M_allocated_capacity - sVar2) >> 4;
  if (index < uVar3) {
    this_00 = Units::pFunc(*(Units **)(sVar2 + index * 0x10));
    ParentedEntity::ParentedEntityImpl::removeParent((ParentedEntityImpl *)this_00);
    std::
    vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>::
    _M_erase((vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
              *)&(this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.
                 mPimpl[4].mId._M_string_length,
             (shared_ptr<libcellml::Units> *)(sVar2 + index * 0x10));
  }
  return index < uVar3;
}

Assistant:

bool Model::removeUnits(size_t index)
{
    bool status = false;
    if (index < pFunc()->mUnits.size()) {
        auto result = pFunc()->mUnits.begin() + ptrdiff_t(index);
        (*result)->pFunc()->removeParent();
        pFunc()->mUnits.erase(result);
        status = true;
    }

    return status;
}